

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,DimensionPrinter>::
ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<int>,int>::LinearExprHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,DimensionPrinter>
           *this,int num_terms)

{
  if (0 < num_terms) {
    do {
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_DimensionPrinter>::
      ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_DimensionPrinter>
                *)this,**(uint **)(this + 8));
      BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
      num_terms = num_terms + -1;
    } while (num_terms != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}